

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::QuantizationParams::SerializeWithCachedSizes
          (QuantizationParams *this,CodedOutputStream *output)

{
  uint32 uVar1;
  
  if (this->numberofbits_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt64(1,this->numberofbits_,output);
  }
  uVar1 = this->_oneof_case_[0];
  if (uVar1 == 0x65) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x65,&((this->QuantizationType_).linearquantization_)->super_MessageLite,output);
    uVar1 = this->_oneof_case_[0];
  }
  if (uVar1 == 0x66) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x66,&((this->QuantizationType_).linearquantization_)->super_MessageLite,output);
    return;
  }
  return;
}

Assistant:

void QuantizationParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.QuantizationParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // uint64 numberOfBits = 1;
  if (this->numberofbits() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(1, this->numberofbits(), output);
  }

  // .CoreML.Specification.LinearQuantizationParams linearQuantization = 101;
  if (has_linearquantization()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      101, *QuantizationType_.linearquantization_, output);
  }

  // .CoreML.Specification.LookUpTableQuantizationParams lookupTableQuantization = 102;
  if (has_lookuptablequantization()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      102, *QuantizationType_.lookuptablequantization_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.QuantizationParams)
}